

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingReporter.cpp
# Opt level: O0

shared_ptr<ApprovalTests::BlockingReporter>
ApprovalTests::BlockingReporter::onMachinesNotNamed(string *machineName)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  MachineBlocker *in_RDI;
  shared_ptr<ApprovalTests::BlockingReporter> sVar1;
  shared_ptr<ApprovalTests::MachineBlocker> machineBlocker;
  MachineBlocker *in_stack_ffffffffffffffb8;
  string *in_stack_ffffffffffffffc8;
  
  MachineBlocker::onMachinesNotNamed(in_stack_ffffffffffffffc8);
  ::std::make_shared<ApprovalTests::MachineBlocker,ApprovalTests::MachineBlocker>
            (in_stack_ffffffffffffffb8);
  MachineBlocker::~MachineBlocker(in_RDI);
  ::std::
  make_shared<ApprovalTests::BlockingReporter,std::shared_ptr<ApprovalTests::MachineBlocker>&>
            ((shared_ptr<ApprovalTests::MachineBlocker> *)in_stack_ffffffffffffffb8);
  ::std::shared_ptr<ApprovalTests::MachineBlocker>::~shared_ptr
            ((shared_ptr<ApprovalTests::MachineBlocker> *)0x20af63);
  sVar1.super___shared_ptr<ApprovalTests::BlockingReporter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<ApprovalTests::BlockingReporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<ApprovalTests::BlockingReporter>)
         sVar1.super___shared_ptr<ApprovalTests::BlockingReporter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BlockingReporter>
    BlockingReporter::onMachinesNotNamed(const std::string& machineName)
    {
        auto machineBlocker = std::make_shared<MachineBlocker>(
            MachineBlocker::onMachinesNotNamed(machineName));
        return std::make_shared<BlockingReporter>(machineBlocker);
    }